

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O3

HighsStatus extractTriangularHessian(HighsOptions *options,HighsHessian *hessian)

{
  ulong uVar1;
  uint uVar2;
  pointer piVar3;
  pointer pdVar4;
  HighsStatus HVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  
  uVar11 = (ulong)hessian->dim_;
  HVar5 = kOk;
  piVar6 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = 0;
  if (0 < (long)uVar11) {
    piVar3 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *piVar6;
    uVar8 = 0;
    iVar9 = 0;
    do {
      uVar1 = uVar8 + 1;
      iVar10 = piVar6[uVar8 + 1];
      iVar7 = iVar9;
      if (iVar12 < iVar10) {
        pdVar4 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (long)iVar12;
        do {
          uVar2 = piVar3[lVar13];
          if ((long)uVar8 <= (long)(int)uVar2) {
            piVar3[iVar7] = uVar2;
            pdVar4[iVar7] = pdVar4[lVar13];
            if ((uVar8 == uVar2) && (iVar9 < iVar7)) {
              piVar3[iVar7] = piVar3[iVar9];
              pdVar4[iVar7] = pdVar4[iVar9];
              piVar3[iVar9] = uVar2;
              pdVar4[iVar9] = pdVar4[lVar13];
            }
            iVar7 = iVar7 + 1;
            iVar10 = piVar6[uVar1];
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar10);
      }
      iVar12 = iVar10;
      piVar6[uVar8] = iVar9;
      uVar8 = uVar1;
      iVar9 = iVar7;
    } while (uVar1 != uVar11);
  }
  if (piVar6[uVar11] != iVar7) {
    bVar14 = hessian->format_ == kTriangular;
    if (bVar14) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                   "Ignored %d entries of Hessian in opposite triangle\n");
      piVar6 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    HVar5 = (HighsStatus)bVar14;
    piVar6[uVar11] = iVar7;
  }
  hessian->format_ = kTriangular;
  return HVar5;
}

Assistant:

HighsStatus extractTriangularHessian(const HighsOptions& options,
                                     HighsHessian& hessian) {
  // Viewing the Hessian column-wise, remove any entries in the strict
  // upper triangle
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  HighsInt nnz = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    const HighsInt nnz0 = nnz;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      if (iRow < iCol) continue;
      hessian.index_[nnz] = iRow;
      hessian.value_[nnz] = hessian.value_[iEl];
      if (iRow == iCol && nnz > nnz0) {
        // Diagonal entry is not first in column so swap it in
        hessian.index_[nnz] = hessian.index_[nnz0];
        hessian.value_[nnz] = hessian.value_[nnz0];
        hessian.index_[nnz0] = iRow;
        hessian.value_[nnz0] = hessian.value_[iEl];
      }
      nnz++;
    }
    hessian.start_[iCol] = nnz0;
  }
  const HighsInt num_ignored_nz = hessian.start_[dim] - nnz;
  assert(num_ignored_nz >= 0);
  if (num_ignored_nz) {
    if (hessian.format_ == HessianFormat::kTriangular) {
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Ignored %" HIGHSINT_FORMAT
                   " entries of Hessian in opposite triangle\n",
                   num_ignored_nz);
      return_status = HighsStatus::kWarning;
    }
    hessian.start_[dim] = nnz;
  }
  assert(hessian.start_[dim] == nnz);
  hessian.format_ = HessianFormat::kTriangular;
  return return_status;
}